

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree * capnp::operator*(StringTree *__return_storage_ptr__,Builder *param_2)

{
  Reader local_a8;
  Reader local_68;
  Builder *local_20;
  Builder *value_local;
  StringTree *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  DynamicList::Builder::asReader(&local_a8,param_2);
  DynamicValue::Reader::Reader(&local_68,&local_a8);
  anon_unknown_2::stringify(__return_storage_ptr__,&local_68);
  DynamicValue::Reader::~Reader(&local_68);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(const DynamicList::Builder& value) { return stringify(value.asReader()); }